

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  int iVar2;
  uint local_58;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  int w_local;
  secp256k1_scalar *a_local;
  int len_local;
  int *wnaf_local;
  
  _bit = *(undefined8 *)a->d;
  s.d._0_8_ = *(undefined8 *)(a->d + 2);
  s.d._8_8_ = *(undefined8 *)(a->d + 4);
  s.d._16_8_ = *(undefined8 *)(a->d + 6);
  sign = -1;
  carry = 0;
  now = 1;
  word = 0;
  s.d[6] = w;
  unique0x10000120 = a;
  memset(wnaf,0,(long)len << 2);
  uVar1 = secp256k1_scalar_get_bits((secp256k1_scalar *)&bit,0xff,1);
  if (uVar1 != 0) {
    secp256k1_scalar_negate((secp256k1_scalar *)&bit,(secp256k1_scalar *)&bit);
    now = -1;
  }
  while (carry < len) {
    uVar1 = secp256k1_scalar_get_bits((secp256k1_scalar *)&bit,carry,1);
    if (uVar1 == word) {
      carry = carry + 1;
    }
    else {
      local_58 = s.d[6];
      if (len - carry < (int)s.d[6]) {
        local_58 = len - carry;
      }
      uVar1 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)&bit,carry,local_58);
      iVar2 = uVar1 + word;
      word = iVar2 >> ((byte)s.d[6] - 1 & 0x1f) & 1;
      wnaf[carry] = now * (iVar2 - (word << ((byte)s.d[6] & 0x1f)));
      sign = carry;
      carry = local_58 + carry;
    }
  }
  return sign + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s = *a;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}